

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_add_mct(opj_tcp_v2_t *p_tcp,opj_image_t *p_image,OPJ_UINT32 p_index)

{
  int *piVar1;
  uint *puVar2;
  OPJ_UINT32 OVar3;
  void *pvVar4;
  undefined4 *__ptr;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  opj_tccp_t *l_tccp;
  OPJ_UINT32 *l_current_offset_data;
  OPJ_UINT32 *l_offset_data;
  OPJ_UINT32 l_nb_elem;
  OPJ_UINT32 l_offset_size;
  OPJ_UINT32 l_mct_size;
  OPJ_UINT32 l_data_size;
  opj_mct_data_t *l_offset_array;
  opj_mct_data_t *l_deco_array;
  opj_simple_mcc_decorrelation_data_t *l_mcc_record;
  OPJ_UINT32 i;
  long local_60;
  undefined4 *local_58;
  uint local_20;
  
  piVar1 = *(int **)(in_RDI + 0x1618);
  local_20 = 0;
  while ((local_20 < *(uint *)(in_RDI + 0x1620) && (*piVar1 != in_EDX))) {
    local_20 = local_20 + 1;
  }
  if ((local_20 != *(uint *)(in_RDI + 0x1620)) && (piVar1[1] == *(int *)(in_RSI + 0x10))) {
    puVar2 = *(uint **)(piVar1 + 2);
    if (puVar2 != (uint *)0x0) {
      if (puVar2[6] != MCT_ELEMENT_SIZE[*puVar2] * *(int *)(in_RSI + 0x10) * *(int *)(in_RSI + 0x10)
         ) {
        return 0;
      }
      OVar3 = *(int *)(in_RSI + 0x10) * *(int *)(in_RSI + 0x10);
      pvVar4 = malloc((ulong)(OVar3 * 4));
      *(void **)(in_RDI + 0x15f8) = pvVar4;
      if (*(long *)(in_RDI + 0x15f8) == 0) {
        return 0;
      }
      (*j2k_mct_read_functions_to_float[*puVar2])
                (*(void **)(puVar2 + 4),*(void **)(in_RDI + 0x15f8),OVar3);
    }
    puVar2 = *(uint **)(piVar1 + 4);
    if (puVar2 != (uint *)0x0) {
      if (puVar2[6] != MCT_ELEMENT_SIZE[*puVar2] * *(int *)(in_RSI + 0x10)) {
        return 0;
      }
      OVar3 = *(OPJ_UINT32 *)(in_RSI + 0x10);
      __ptr = (undefined4 *)malloc((ulong)(OVar3 << 2));
      if (__ptr == (undefined4 *)0x0) {
        return 0;
      }
      (*j2k_mct_read_functions_to_int32[*puVar2])(*(void **)(puVar2 + 4),__ptr,OVar3);
      local_60 = *(long *)(in_RDI + 0x15d0);
      local_58 = __ptr;
      for (local_20 = 0; local_20 < *(uint *)(in_RSI + 0x10); local_20 = local_20 + 1) {
        *(undefined4 *)(local_60 + 0x434) = *local_58;
        local_60 = local_60 + 0x438;
        local_58 = local_58 + 1;
      }
      free(__ptr);
    }
  }
  return 1;
}

Assistant:

opj_bool j2k_add_mct(opj_tcp_v2_t * p_tcp, opj_image_t * p_image, OPJ_UINT32 p_index)
{
	OPJ_UINT32 i;
	opj_simple_mcc_decorrelation_data_t * l_mcc_record;
	opj_mct_data_t * l_deco_array, * l_offset_array;
	OPJ_UINT32 l_data_size,l_mct_size, l_offset_size;
	OPJ_UINT32 l_nb_elem;
	OPJ_UINT32 * l_offset_data, * l_current_offset_data;
	opj_tccp_t * l_tccp;

	/* preconditions */
	assert(p_tcp != 00);

	l_mcc_record = p_tcp->m_mcc_records;

	for (i=0;i<p_tcp->m_nb_mcc_records;++i) {
		if (l_mcc_record->m_index == p_index) {
			break;
		}
	}

	if (i==p_tcp->m_nb_mcc_records) {
		/** element discarded **/
		return OPJ_TRUE;
	}

	if (l_mcc_record->m_nb_comps != p_image->numcomps) {
		/** do not support number of comps != image */
		return OPJ_TRUE;
	}

	l_deco_array = l_mcc_record->m_decorrelation_array;

	if (l_deco_array) {
		l_data_size = MCT_ELEMENT_SIZE[l_deco_array->m_element_type] * p_image->numcomps * p_image->numcomps;
		if (l_deco_array->m_data_size != l_data_size) {
			return OPJ_FALSE;
		}

		l_nb_elem = p_image->numcomps * p_image->numcomps;
		l_mct_size = l_nb_elem * sizeof(OPJ_FLOAT32);
		p_tcp->m_mct_decoding_matrix = (OPJ_FLOAT32*)opj_malloc(l_mct_size);

		if (! p_tcp->m_mct_decoding_matrix ) {
			return OPJ_FALSE;
		}

		j2k_mct_read_functions_to_float[l_deco_array->m_element_type](l_deco_array->m_data,p_tcp->m_mct_decoding_matrix,l_nb_elem);
	}

	l_offset_array = l_mcc_record->m_offset_array;

	if (l_offset_array) {
		l_data_size = MCT_ELEMENT_SIZE[l_offset_array->m_element_type] * p_image->numcomps;
		if (l_offset_array->m_data_size != l_data_size) {
			return OPJ_FALSE;
		}

		l_nb_elem = p_image->numcomps;
		l_offset_size = l_nb_elem * sizeof(OPJ_UINT32);
		l_offset_data = (OPJ_UINT32*)opj_malloc(l_offset_size);

		if (! l_offset_data ) {
			return OPJ_FALSE;
		}

		j2k_mct_read_functions_to_int32[l_offset_array->m_element_type](l_offset_array->m_data,l_offset_data,l_nb_elem);

		l_tccp = p_tcp->tccps;
		l_current_offset_data = l_offset_data;

		for (i=0;i<p_image->numcomps;++i) {
			l_tccp->m_dc_level_shift = *(l_current_offset_data++);
			++l_tccp;
		}

		opj_free(l_offset_data);
	}

	return OPJ_TRUE;
}